

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double expected_sd_cat_single<unsigned_long,unsigned_long,double>
                 (unsigned_long *counts,double *p,size_t n,unsigned_long *pos,size_t cat_exclude,
                 unsigned_long cnt)

{
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  unsigned_long *in_R9;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t cat2;
  size_t cat1;
  double cum_var;
  size_t cat;
  double cnt_div;
  size_t ix_exclude;
  ulong local_68;
  ulong local_60;
  double local_58;
  unsigned_long *in_stack_ffffffffffffffb0;
  ulong uVar7;
  size_t in_stack_ffffffffffffffb8;
  double *in_stack_ffffffffffffffc0;
  double local_8;
  
  if (in_R8 == 0) {
    local_8 = expected_sd_cat<unsigned_long,unsigned_long,double>
                        (in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0);
  }
  else if (in_R8 == in_RDX - 1) {
    local_8 = expected_sd_cat<unsigned_long,unsigned_long,double>
                        (in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0);
  }
  else {
    lVar2 = in_RCX[in_R8];
    lVar4 = (long)in_R9 - *(long *)(in_RDI + lVar2 * 8);
    auVar5._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = 0x45300000;
    for (uVar7 = 0; uVar7 < in_RDX; uVar7 = uVar7 + 1) {
      uVar1 = *(undefined8 *)(in_RDI + in_RCX[uVar7] * 8);
      auVar6._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar6._0_8_ = uVar1;
      auVar6._12_4_ = 0x45300000;
      *(double *)(in_RSI + in_RCX[uVar7] * 8) =
           ((auVar6._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
           ((auVar5._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0));
    }
    if (in_R8 == 1) {
      local_58 = (((-(*(double *)(in_RSI + *in_RCX * 8) * *(double *)(in_RSI + *in_RCX * 8)) / 3.0 -
                   (*(double *)(in_RSI + *in_RCX * 8) * *(double *)(in_RSI + in_RCX[2] * 8)) / 2.0)
                  + *(double *)(in_RSI + *in_RCX * 8) / 3.0) -
                 (*(double *)(in_RSI + in_RCX[2] * 8) * *(double *)(in_RSI + in_RCX[2] * 8)) / 3.0)
                 + *(double *)(in_RSI + in_RCX[2] * 8) / 3.0;
    }
    else {
      local_58 = (((-(*(double *)(in_RSI + *in_RCX * 8) * *(double *)(in_RSI + *in_RCX * 8)) / 3.0 -
                   (*(double *)(in_RSI + *in_RCX * 8) * *(double *)(in_RSI + in_RCX[1] * 8)) / 2.0)
                  + *(double *)(in_RSI + *in_RCX * 8) / 3.0) -
                 (*(double *)(in_RSI + in_RCX[1] * 8) * *(double *)(in_RSI + in_RCX[1] * 8)) / 3.0)
                 + *(double *)(in_RSI + in_RCX[1] * 8) / 3.0;
    }
    iVar3 = 2;
    if (in_R8 == 1) {
      iVar3 = 3;
    }
    for (local_60 = (ulong)iVar3; local_60 < in_RDX; local_60 = local_60 + 1) {
      if (in_RCX[local_60] != lVar2) {
        local_58 = (*(double *)(in_RSI + in_RCX[local_60] * 8) / 3.0 -
                   (*(double *)(in_RSI + in_RCX[local_60] * 8) *
                   *(double *)(in_RSI + in_RCX[local_60] * 8)) / 3.0) + local_58;
        for (local_68 = 0; local_68 < local_60; local_68 = local_68 + 1) {
          if (in_RCX[local_68] != lVar2) {
            local_58 = local_58 -
                       (*(double *)(in_RSI + in_RCX[local_60] * 8) *
                       *(double *)(in_RSI + in_RCX[local_68] * 8)) / 2.0;
          }
        }
      }
    }
    if (local_58 <= 0.0) {
      local_58 = 0.0;
    }
    local_8 = SQRT(local_58);
  }
  return local_8;
}

Assistant:

double expected_sd_cat_single(number *restrict counts, double *restrict p, size_t n, int_t *restrict pos, size_t cat_exclude, number cnt)
{
    if (cat_exclude == 0)
        return expected_sd_cat<number, int_t, ldouble_safe>(counts, p, n-1, pos + 1);

    else if (cat_exclude == (n-1))
        return expected_sd_cat<number, int_t, ldouble_safe>(counts, p, n-1, pos);

    size_t ix_exclude = pos[cat_exclude];

    ldouble_safe cnt_div = (ldouble_safe) (cnt - counts[ix_exclude]);
    for (size_t cat = 0; cat < n; cat++)
        p[pos[cat]] = (ldouble_safe)counts[pos[cat]] / cnt_div;

    ldouble_safe cum_var;
    if (cat_exclude != 1)
        cum_var = -square(p[pos[0]]) / 3.0 - p[pos[0]] * p[pos[1]] / 2.0 + p[pos[0]] / 3.0  - square(p[pos[1]]) / 3.0 + p[pos[1]] / 3.0;
    else
        cum_var = -square(p[pos[0]]) / 3.0 - p[pos[0]] * p[pos[2]] / 2.0 + p[pos[0]] / 3.0  - square(p[pos[2]]) / 3.0 + p[pos[2]] / 3.0;
    for (size_t cat1 = (cat_exclude == 1)? 3 : 2; cat1 < n; cat1++)
    {
        if (pos[cat1] == ix_exclude) continue;
        cum_var += p[pos[cat1]] / 3.0 - square(p[pos[cat1]]) / 3.0;
        for (size_t cat2 = 0; cat2 < cat1; cat2++)
        {
            if (pos[cat2] == ix_exclude) continue;
            cum_var -= p[pos[cat1]] * p[pos[cat2]] / 2.0;
        }

    }
    return std::sqrt(std::fmax(cum_var, (ldouble_safe)0));
}